

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  element_type *peVar2;
  not_null<_IO_FILE_*> this;
  bool bVar3;
  ostream *poVar4;
  indirect_string *this_00;
  value_reference_type ppVar5;
  uint uVar6;
  ulong uVar7;
  pointer *__ptr;
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *phVar8;
  ulong uVar9;
  bool bVar10;
  raw_sstring_view rVar11;
  shared_sstring_view owner;
  shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  strings;
  switches opt;
  shared_ptr<const_char> ptr;
  database db;
  raw_sstring_view str;
  sstring_view<std::shared_ptr<const_char>_> local_3c8;
  not_null<_IO_FILE_*> local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a0;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  uint local_358;
  char local_354;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_350;
  not_null<const_pstore::sstring_view<const_char_*>_*> local_348;
  undefined1 local_340 [224];
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *local_260;
  _Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
  local_258;
  undefined1 local_250 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  uint local_210;
  bool local_20c;
  uint local_208;
  sstring_view<const_char_*> local_130;
  undefined1 local_120 [232];
  _Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
  local_38;
  
  local_398._M_string_length = 0;
  local_398.field_2._M_local_buf[0] = '\0';
  local_378._M_string_length = 0;
  local_378.field_2._M_local_buf[0] = '\0';
  local_358 = 0xffffffff;
  local_354 = 0;
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  get_switches((pair<switches,_int> *)local_250,argc,argv);
  std::__cxx11::string::operator=((string *)&local_398,(string *)local_250);
  std::__cxx11::string::operator=((string *)&local_378,(string *)(local_250 + 0x20));
  local_354 = local_20c;
  local_358 = local_210;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_allocated_capacity != &local_220) {
    operator_delete((void *)local_230._M_allocated_capacity,local_220._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
  }
  uVar6 = local_208;
  if (local_208 == 0) {
    pstore::database::database((database *)local_250,&local_398,read_only,true);
    pstore::database::sync((database *)local_250);
    if (local_354 == '\x01') {
      pstore::index::
      get_index<(pstore::trailer::indices)3,pstore::database_const,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const>
                ((index *)&local_3a8,(database *)local_250,true);
      this.ptr_ = local_3a8.ptr_;
      bVar10 = local_3a8.ptr_ == (_IO_FILE *)0x0;
      if (bVar10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: Strings index was not found",0x22);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
      }
      else {
        local_348.ptr_ = &local_130;
        local_130.ptr_ = local_378._M_dataplus._M_p;
        local_130.size_ = local_378._M_string_length;
        pstore::gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::ensure_invariant
                  (&local_348);
        pstore::indirect_string::indirect_string
                  ((indirect_string *)local_340,(database *)local_250,local_348);
        pstore::index::
        hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
        ::find<pstore::indirect_string,void>
                  ((const_iterator *)local_120,this.ptr_,(database *)local_250,
                   (indirect_string *)local_340);
        phVar8 = (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                  *)(local_3a8.ptr_ + 8);
        memset(local_340 + 8,0,0xd8);
        local_258._M_head_impl =
             (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0;
        local_340._0_8_ = (database *)local_250;
        local_260 = phVar8;
        bVar3 = pstore::index::
                hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                ::iterator_base<true>::operator==
                          ((iterator_base<true> *)local_120,(iterator_base<true> *)local_340);
        if (local_258._M_head_impl !=
            (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0) {
          operator_delete(local_258._M_head_impl,0x20);
        }
        if (bVar3) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_378._M_dataplus._M_p,
                              local_378._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": not found",0xb);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        else {
          local_3c8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_3c8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_3c8.size_ = 0;
          this_00 = &pstore::index::
                     hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                     ::iterator_base<true>::operator*((iterator_base<true> *)local_120)->first;
          local_350.ptr_ = &local_3c8;
          pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::
          ensure_invariant(&local_350);
          rVar11 = pstore::indirect_string::as_db_string_view(this_00,local_350);
          local_340._0_8_ = (database *)(local_340 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_340,rVar11.ptr_,rVar11.ptr_ + rVar11.size_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_340._0_8_,local_340._8_8_);
          if ((database *)local_340._0_8_ != (database *)(local_340 + 0x10)) {
            operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
          }
          if (local_3c8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_3c8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (local_38._M_head_impl !=
            (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0) {
          operator_delete(local_38._M_head_impl,0x20);
        }
      }
    }
    else {
      pstore::index::
      get_index<(pstore::trailer::indices)5,pstore::database_const,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>const>
                ((index *)&local_3c8,(database *)local_250,true);
      bVar10 = (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                *)local_3c8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               == (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                   *)0x0;
      if (bVar10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: Names index was not found",0x20);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
        local_3a0 = local_3c8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      }
      else {
        pstore::index::
        hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
        ::find<std::__cxx11::string,void>
                  ((const_iterator *)local_120,
                   local_3c8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (database *)local_250,&local_378);
        peVar2 = local_3c8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        memset(local_340 + 8,0,0xd8);
        local_260 = (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                     *)peVar2;
        local_258._M_head_impl =
             (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0;
        local_340._0_8_ = (database *)local_250;
        bVar3 = pstore::index::
                hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::iterator_base<true>::operator==
                          ((iterator_base<true> *)local_120,(iterator_base<true> *)local_340);
        if (local_258._M_head_impl !=
            (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0) {
          std::
          default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
          ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                        *)&local_258,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                        *)local_258._M_head_impl);
        }
        if (bVar3) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_378._M_dataplus._M_p,
                              local_378._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": not found",0xb);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        else {
          ppVar5 = pstore::index::
                   hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::iterator_base<true>::operator*((iterator_base<true> *)local_120);
          pstore::database::getro<char,void>((database *)local_340,(extent<char> *)local_250);
          lVar1 = *(long *)(std::cout + -0x18);
          *(undefined4 *)(&DAT_001362bc + lVar1) = 5;
          std::ios::clear((int)lVar1 + 0x1362a0);
          uVar9 = (ppVar5->second).size;
          local_3a8.ptr_ = _stdout;
          pstore::gsl::not_null<_IO_FILE_*>::ensure_invariant(&local_3a8);
          for (; uVar9 != 0; uVar9 = uVar9 - uVar7) {
            uVar7 = 0x7fffffffffffffff;
            if (uVar9 < 0x7fffffffffffffff) {
              uVar7 = uVar9;
            }
            std::ostream::write((char *)&std::cout,local_340._0_8_);
          }
          if ((internal_node *)local_340._8_8_ != (internal_node *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_340._8_8_);
          }
        }
        local_3a0 = local_3c8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
        if ((_Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
             )local_38._M_head_impl !=
            (_Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
             )0x0) {
          std::
          default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
          ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                        *)&local_38,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                        *)local_38._M_head_impl);
          local_3a0 = local_3c8.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        }
      }
    }
    if (local_3a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0);
    }
    uVar6 = (uint)bVar10;
    pstore::database::~database((database *)local_250);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,
                    CONCAT71(local_378.field_2._M_allocated_capacity._1_7_,
                             local_378.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,
                    CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                             local_398.field_2._M_local_buf[0]) + 1);
  }
  return uVar6;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    PSTORE_TRY {
        switches opt;
        std::tie (opt, exit_code) = get_switches (argc, argv);
        if (exit_code != EXIT_SUCCESS) {
            return exit_code;
        }

        pstore::database db{opt.db_path, pstore::database::access_mode::read_only};
        db.sync (opt.revision);

        bool const ok =
            opt.string_mode ? read_strings_index (db, opt.key) : read_names_index (db, opt.key);
        exit_code = ok ? EXIT_SUCCESS : EXIT_FAILURE;
    }